

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

bool __thiscall
ON_Annotation::SetOverrideDimensionStyle(ON_Annotation *this,ON_DimStyle **override_style)

{
  bool bVar1;
  ON_UUID *b;
  undefined1 in_R9B;
  ON_UUID parent_id;
  ON_UUID *local_58;
  bool bIssueErrorsAndWarnings;
  bool bRequireSetOverrides;
  ON_UUID candidate_parent_id;
  ON_DimStyle **override_style_local;
  ON_Annotation *this_local;
  
  if ((this->m_override_dimstyle == (ON_DimStyle *)0x0) ||
     (this->m_override_dimstyle != *override_style)) {
    Internal_DeleteOverrideDimstyle(this);
    if (*override_style == (ON_DimStyle *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = ::operator==(&ON_nil_uuid,&this->m_dimstyle_id);
      if (bVar1) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_annotationbase.cpp"
                   ,0x40e,"","this->m_dimstyle_id must be non-nil to override a dimstyle.");
        this_local._7_1_ = false;
      }
      else {
        bVar1 = ON_ModelComponent::ParentIdIsNil(&(*override_style)->super_ON_ModelComponent);
        if (bVar1) {
          local_58 = &ON_nil_uuid;
        }
        else {
          local_58 = &this->m_dimstyle_id;
        }
        parent_id.Data4[0] = '\0';
        parent_id.Data4[1] = '\0';
        parent_id.Data4[2] = '\0';
        parent_id.Data4[3] = '\0';
        parent_id.Data4[4] = '\0';
        parent_id.Data4[5] = '\0';
        parent_id.Data4[6] = '\0';
        parent_id.Data4[7] = '\0';
        parent_id._0_8_ = *(ulong *)local_58->Data4;
        bVar1 = Internal_IsOverrideDimStyleCandidate
                          ((ON_Annotation *)*override_style,*(ON_DimStyle **)local_58,parent_id,true
                           ,(bool)in_R9B);
        if (bVar1) {
          bVar1 = ON_ModelComponent::SetParentId
                            (&(*override_style)->super_ON_ModelComponent,&this->m_dimstyle_id);
          if (bVar1) {
            b = ON_ModelComponent::ParentId(&(*override_style)->super_ON_ModelComponent);
            bVar1 = ::operator!=(&this->m_dimstyle_id,b);
            if (!bVar1) {
              ON_ModelComponent::ClearId(&(*override_style)->super_ON_ModelComponent);
              ON_ModelComponent::LockId(&(*override_style)->super_ON_ModelComponent);
              ON_ModelComponent::ClearName(&(*override_style)->super_ON_ModelComponent);
              ON_ModelComponent::LockName(&(*override_style)->super_ON_ModelComponent);
              ON_ModelComponent::ClearIndex(&(*override_style)->super_ON_ModelComponent);
              ON_ModelComponent::LockIndex(&(*override_style)->super_ON_ModelComponent);
              this->m_override_dimstyle = *override_style;
              *override_style = (ON_DimStyle *)0x0;
              return true;
            }
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_annotationbase.cpp"
                     ,0x42a,"","override_style->SetParentId(this->m_dimstyle_id) failed.");
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_annotationbase.cpp"
               ,0x400,"","m_override_dimstyle = override_style");
    *override_style = (ON_DimStyle *)0x0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Annotation::SetOverrideDimensionStyle(ON_DimStyle*& override_style) const
{
  if (nullptr != m_override_dimstyle && m_override_dimstyle == override_style)
  {
    // The caller is very confused.
    // override_style is already managed by this ON_Annotation instance.
    // Going further will cause a crash.
    // This is a serious error caused by a serious bug in the calling code.
    ON_ERROR("m_override_dimstyle = override_style");
    override_style = nullptr;
    return false;
  }
  Internal_DeleteOverrideDimstyle();

  // handle simple cases of "clearing overrides" first.
  if (nullptr == override_style)
    return true;

  if (ON_nil_uuid == m_dimstyle_id)
  {
    // ON_ERROR automatically fills in function name and new lines when needed.
    //ON_ERROR("SetOverrideDimensionStyle(): this->m_dimstyle_id must be non-nil to override a dimstyle.\n");
    ON_ERROR("this->m_dimstyle_id must be non-nil to override a dimstyle.");
    return false;
  }

  // Do not require overrides to be set. Some workflows add dimstyle with no overrides set and then
  // modify that dimstyle.

  //if (false == override_style->HasOverrides())
  //{
  //  // skip detailed validation steps that don't matter.
  //  delete override_style;
  //  return true;
  //}

  const ON_UUID candidate_parent_id
    = override_style->ParentIdIsNil()
    ? ON_nil_uuid
    : m_dimstyle_id;
  const bool bRequireSetOverrides = false;
  const bool bIssueErrorsAndWarnings = true;
  if (false == ON_Annotation::Internal_IsOverrideDimStyleCandidate(override_style, candidate_parent_id, bRequireSetOverrides, bIssueErrorsAndWarnings) )
  {
    // invalid override_style
    return false;
  }

  if (false == override_style->SetParentId(m_dimstyle_id) || m_dimstyle_id != override_style->ParentId())
  {
    ON_ERROR("override_style->SetParentId(this->m_dimstyle_id) failed.");
    return false;
  }

  // override_style's must have unset id (= nil), unset index = (ON_UNSET_INT_INDEX), unset name (empty)
  override_style->ClearId();
  override_style->LockId();

  override_style->ClearName();
  override_style->LockName();

  override_style->ClearIndex();
  override_style->LockIndex(); 

  m_override_dimstyle = override_style;
  override_style = nullptr;

  return true;
}